

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

void testFutureProofing(string *tempDir)

{
  int iVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,tempDir,"imf_test_future_proofing.exr");
  std::__cxx11::string::operator=
            ((string *)&(anonymous_namespace)::filename_abi_cxx11_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing reading future-files");
  std::endl<char,std::char_traits<char>>(poVar2);
  random_reseed(1);
  IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::numThreads();
  iVar1 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar1);
  anon_unknown.dwarf_1335b8::testWriteRead(1);
  anon_unknown.dwarf_1335b8::testWriteRead(10);
  iVar1 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void
testFutureProofing (const std::string& tempDir)
{
    filename = tempDir + "imf_test_future_proofing.exr";

    try
    {
        cout << "Testing reading future-files" << endl;

        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (4);

        testWriteRead (1);
        testWriteRead (10);

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}